

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

StructurePtr __thiscall soul::heart::Parser::findStruct(Parser *this,string *name)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  Structure *s;
  bool bVar4;
  int iVar5;
  long *plVar6;
  undefined8 *in_RDX;
  long lVar7;
  bool bVar8;
  bool bVar9;
  string_view name_00;
  _func_int **local_80;
  pool_ptr<const_soul::Module> local_58;
  string local_50;
  
  if (name[4]._M_string_length == 0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  name_00._M_len = name[4]._M_string_length + 0x368;
  name_00._M_str = (char *)in_RDX[1];
  Module::Structs::find((Structs *)this,name_00);
  if ((this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser == (_func_int **)0x0) {
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
    lVar1 = *(long *)((long)&name[3].field_2 + 8);
    plVar2 = *(long **)(lVar1 + 0x48);
    local_80 = (this->
               super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               )._vptr_Tokeniser;
    for (plVar6 = *(long **)(lVar1 + 0x40); bVar4 = plVar6 != plVar2, bVar4; plVar6 = plVar6 + 1) {
      lVar1 = *(long *)(*plVar6 + 0x370);
      bVar8 = lVar1 == 0;
      if (!bVar8) {
        lVar3 = *(long *)(*plVar6 + 0x368);
        lVar7 = 0;
        do {
          s = *(Structure **)(lVar3 + lVar7);
          if (s == (Structure *)0x0) {
            (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser = local_80;
            throwInternalCompilerError("object != nullptr","operator*",0x46);
          }
          local_58.object = (Module *)0x0;
          Program::ProgramImpl::getStructNameWithQualificationIfNeeded_abi_cxx11_
                    (&local_50,*(ProgramImpl **)((long)&name[3].field_2 + 8),&local_58,s);
          if (local_50._M_string_length == in_RDX[1]) {
            if (local_50._M_string_length == 0) {
              bVar9 = true;
            }
            else {
              iVar5 = bcmp(local_50._M_dataplus._M_p,(void *)*in_RDX,local_50._M_string_length);
              bVar9 = iVar5 == 0;
            }
          }
          else {
            bVar9 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (bVar9) {
            local_80 = *(_func_int ***)(lVar3 + lVar7);
            if (local_80 != (_func_int **)0x0) {
              *(int *)local_80 = *(int *)local_80 + 1;
            }
            if (!bVar8) {
              (this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              )._vptr_Tokeniser = local_80;
              if (bVar4) {
                return (StructurePtr)(Structure *)this;
              }
              goto LAB_00233489;
            }
            break;
          }
          lVar7 = lVar7 + 8;
          bVar8 = lVar1 << 3 == lVar7;
        } while (!bVar8);
      }
    }
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    )._vptr_Tokeniser = local_80;
LAB_00233489:
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    )._vptr_Tokeniser = (_func_int **)0x0;
  }
  return (StructurePtr)(Structure *)this;
}

Assistant:

StructurePtr findStruct (const std::string& name)
    {
        if (auto s = module->structs.find (name))
            return s;

        for (auto& m : program.getModules())
            for (auto& s : m->structs.get())
                if (program.getFullyQualifiedStructName (*s) == name)
                    return s;

        return {};
    }